

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

int Curl_single_getsock(connectdata *conn,curl_socket_t *sock,int numsocks)

{
  SessionHandle *pSVar1;
  bool bVar2;
  bool local_38;
  uint local_34;
  uint sockindex;
  int bitmap;
  SessionHandle *data;
  int numsocks_local;
  curl_socket_t *sock_local;
  connectdata *conn_local;
  
  pSVar1 = conn->data;
  local_38 = false;
  if (conn->handler->perform_getsock == (_func_int_connectdata_ptr_curl_socket_t_ptr_int *)0x0) {
    if (numsocks < 2) {
      conn_local._4_4_ = 0;
    }
    else {
      bVar2 = ((pSVar1->req).keepon & 0x15U) == 1;
      if (bVar2) {
        *sock = conn->sockfd;
      }
      local_34 = (uint)bVar2;
      if (((pSVar1->req).keepon & 0x2aU) == 2) {
        if ((conn->sockfd != conn->writesockfd) || (local_34 == 0)) {
          local_38 = local_34 != 0;
          sock[local_38] = conn->writesockfd;
        }
        local_34 = 1 << (local_38 + 0x10U & 0x1f) | local_34;
      }
      conn_local._4_4_ = local_34;
    }
  }
  else {
    conn_local._4_4_ = (*conn->handler->perform_getsock)(conn,sock,numsocks);
  }
  return conn_local._4_4_;
}

Assistant:

int Curl_single_getsock(const struct connectdata *conn,
                        curl_socket_t *sock, /* points to numsocks number
                                                of sockets */
                        int numsocks)
{
  const struct SessionHandle *data = conn->data;
  int bitmap = GETSOCK_BLANK;
  unsigned sockindex = 0;

  if(conn->handler->perform_getsock)
    return conn->handler->perform_getsock(conn, sock, numsocks);

  if(numsocks < 2)
    /* simple check but we might need two slots */
    return GETSOCK_BLANK;

  /* don't include HOLD and PAUSE connections */
  if((data->req.keepon & KEEP_RECVBITS) == KEEP_RECV) {

    DEBUGASSERT(conn->sockfd != CURL_SOCKET_BAD);

    bitmap |= GETSOCK_READSOCK(sockindex);
    sock[sockindex] = conn->sockfd;
  }

  /* don't include HOLD and PAUSE connections */
  if((data->req.keepon & KEEP_SENDBITS) == KEEP_SEND) {

    if((conn->sockfd != conn->writesockfd) ||
       bitmap == GETSOCK_BLANK) {
      /* only if they are not the same socket and we have a readable
         one, we increase index */
      if(bitmap != GETSOCK_BLANK)
        sockindex++; /* increase index if we need two entries */

      DEBUGASSERT(conn->writesockfd != CURL_SOCKET_BAD);

      sock[sockindex] = conn->writesockfd;
    }

    bitmap |= GETSOCK_WRITESOCK(sockindex);
  }

  return bitmap;
}